

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt
          (MatchInfoCollection *this,int32_t idx,UnicodeString *mzID)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  MatchInfo *match;
  UnicodeString *mzID_local;
  int32_t idx_local;
  MatchInfoCollection *this_local;
  
  icu_63::UnicodeString::remove(mzID,(char *)CONCAT44(in_register_00000034,idx));
  pvVar1 = UVector::elementAt(this->fMatches,idx);
  if ((pvVar1 == (void *)0x0) || (*(char *)((long)pvVar1 + 0x4c) != '\0')) {
    this_local._7_1_ = '\0';
  }
  else {
    icu_63::UnicodeString::setTo(mzID,(UnicodeString *)((long)pvVar1 + 8));
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeZoneNames::MatchInfoCollection::getMetaZoneIDAt(int32_t idx, UnicodeString& mzID) const {
    mzID.remove();
    const MatchInfo* match = (const MatchInfo*)fMatches->elementAt(idx);
    if (match && !match->isTZID) {
        mzID.setTo(match->id);
        return TRUE;
    }
    return FALSE;
}